

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<pstore::gsl::span<int,_1l>>>,std::tuple<pstore::gsl::span<int,_1l>>>
               (tuple<testing::Matcher<pstore::gsl::span<int,__1L>_>_> *matchers,
               tuple<pstore::gsl::span<int,__1L>_> *values,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<pstore::gsl::span<int,__1L>_> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<pstore::gsl::span<int,_-1L>_>::Matcher
            ((Matcher<pstore::gsl::span<int,__1L>_> *)&MStack_1e8,
             (Matcher<pstore::gsl::span<int,__1L>_> *)matchers);
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  bVar1 = MatcherBase<pstore::gsl::span<int,_-1L>_>::MatchAndExplain
                    (&MStack_1e8,(span<int,__1L> *)values,&local_1b0.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<pstore::gsl::span<int,_-1L>_>::DescribeTo
              ((MatcherBase<pstore::gsl::span<int,__1L>_> *)matchers,os);
    std::operator<<(os,"\n           Actual: ");
    ContainerPrinter::PrintValue<pstore::gsl::span<int,_1l>,void>((span<int,__1L> *)values,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }